

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

index __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
::calculate_descending_dimension_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL>
           *this,array<long,_3UL> *stride_list,array<unsigned_long,_3UL> *extent_list,
          general_storage_order<3UL> *storage)

{
  bool bVar1;
  const_reference puVar2;
  const_reference plVar3;
  general_storage_order<3UL> *in_RCX;
  array<unsigned_long,_3UL> *in_RDX;
  array<long,_3UL> *in_RSI;
  size_type n;
  index offset;
  size_type in_stack_ffffffffffffffc8;
  general_storage_order<3UL> *this_00;
  index local_28;
  
  local_28 = 0;
  bVar1 = general_storage_order<3UL>::all_dims_ascending(in_RCX);
  if (!bVar1) {
    for (this_00 = (general_storage_order<3UL> *)0x0; this_00 != (general_storage_order<3UL> *)0x3;
        this_00 = (general_storage_order<3UL> *)((long)(this_00->ordering_).elems + 1)) {
      bVar1 = general_storage_order<3UL>::ascending(this_00,in_stack_ffffffffffffffc8);
      if (!bVar1) {
        puVar2 = array<unsigned_long,_3UL>::operator[](in_RDX,(size_type)this_00);
        in_stack_ffffffffffffffc8 = *puVar2 - 1;
        plVar3 = array<long,_3UL>::operator[](in_RSI,(size_type)this_00);
        local_28 = local_28 - in_stack_ffffffffffffffc8 * *plVar3;
      }
    }
  }
  return local_28;
}

Assistant:

index
  calculate_descending_dimension_offset(const StrideList& stride_list,
                                const ExtentList& extent_list,
                                const general_storage_order<NumDims>& storage)
  {
    index offset = 0;
    if (!storage.all_dims_ascending()) 
      for (size_type n = 0; n != NumDims; ++n)
        if (!storage.ascending(n))
          offset -= (extent_list[n] - 1) * stride_list[n];

    return offset;
  }